

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QRingChunk>::emplace<QRingChunk>
          (QMovableArrayOps<QRingChunk> *this,qsizetype i,QRingChunk *args)

{
  QRingChunk **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_80;
  QRingChunk local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.size == i) {
      qVar4 = QArrayDataPointer<QRingChunk>::freeSpaceAtEnd((QArrayDataPointer<QRingChunk> *)this);
      if (qVar4 == 0) goto LAB_001228db;
      QRingChunk::QRingChunk
                ((this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.ptr
                 + (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.
                   size,args);
LAB_001229d4:
      pqVar2 = &(this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00122993;
    }
LAB_001228db:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QRingChunk>::freeSpaceAtBegin((QArrayDataPointer<QRingChunk> *)this)
      ;
      if (qVar4 != 0) {
        QRingChunk::QRingChunk
                  ((this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.
                   ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.
                   ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_001229d4;
      }
    }
  }
  local_58.tailOffset = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.chunk.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.headOffset = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.chunk.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.chunk.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QRingChunk::QRingChunk(&local_58,args);
  bVar5 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.size != 0;
  QArrayDataPointer<QRingChunk>::detachAndGrow
            ((QArrayDataPointer<QRingChunk> *)this,(uint)(i == 0 && bVar5),1,(QRingChunk **)0x0,
             (QArrayDataPointer<QRingChunk> *)0x0);
  if (i == 0 && bVar5) {
    QRingChunk::QRingChunk
              ((this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.ptr +
               -1,&local_58);
    ppQVar1 = &(this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QRingChunk> *)this,i,1);
    QRingChunk::QRingChunk(local_80.displaceFrom,&local_58);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
LAB_00122993:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }